

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O0

void __thiscall ShellLinkHeader::parseShowCommand(ShellLinkHeader *this)

{
  reference pvVar1;
  ostream *poVar2;
  ShellLinkHeader *this_local;
  
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->ShowCommand,3);
  if (*pvVar1 == 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SW_SHOWNORMAL");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The application is open and its window is open in a normal fashion.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->ShowCommand,3);
  if (*pvVar1 == 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SW_SHOWMAXIMIZED");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The application is open, and keyboard focus is given to the application, but its window is not shown."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->ShowCommand,3);
  if (*pvVar1 == 7) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SW_SHOWMINNOACTIVE");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,
                             "The application is open, but its window is not shown. It is not given the keyboard focus."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void ShellLinkHeader::parseShowCommand(){
        if (ShowCommand[3] == 1)
            cout << "SW_SHOWNORMAL" << endl << Utils::defaultOffsetDocInfo << "The application is open and its window is open in a normal fashion." << endl;
        if (ShowCommand[3] == 3)
            cout << "SW_SHOWMAXIMIZED" << endl << Utils::defaultOffsetDocInfo << "The application is open, and keyboard focus is given to the application, but its window is not shown." << endl;
        if (ShowCommand[3] == 7)
            cout << "SW_SHOWMINNOACTIVE" << endl << Utils::defaultOffsetDocInfo << "The application is open, but its window is not shown. It is not given the keyboard focus." << endl;
    }